

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O1

void ngx_rbtree_insert_timer_value
               (ngx_rbtree_node_t *temp,ngx_rbtree_node_t *node,ngx_rbtree_node_t *sentinel)

{
  ngx_rbtree_node_t *pnVar1;
  bool bVar2;
  
  do {
    pnVar1 = temp;
    bVar2 = -1 < (long)(node->key - pnVar1->key);
    temp = (&pnVar1->left)[bVar2];
  } while ((&pnVar1->left)[bVar2] != sentinel);
  (&pnVar1->left)[bVar2] = node;
  node->parent = pnVar1;
  node->left = sentinel;
  node->right = sentinel;
  node->color = '\x01';
  return;
}

Assistant:

void
ngx_rbtree_insert_timer_value(ngx_rbtree_node_t *temp, ngx_rbtree_node_t *node,
    ngx_rbtree_node_t *sentinel)
{
    ngx_rbtree_node_t  **p;

    for ( ;; ) {

        /*
         * Timer values
         * 1) are spread in small range, usually several minutes,
         * 2) and overflow each 49 days, if milliseconds are stored in 32 bits.
         * The comparison takes into account that overflow.
         */

        /*  node->key < temp->key */

        p = ((ngx_rbtree_key_int_t) (node->key - temp->key) < 0)
            ? &temp->left : &temp->right;

        if (*p == sentinel) {
            break;
        }

        temp = *p;
    }

    *p = node;
    node->parent = temp;
    node->left = sentinel;
    node->right = sentinel;
    ngx_rbt_red(node);
}